

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O0

int __thiscall OpenMD::IndexListContainer::pop(IndexListContainer *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  ostream *poVar4;
  long in_RDI;
  int result;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar6;
  
  bVar2 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty
                    ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     (in_RDI + 8));
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar1 = pvVar3->first;
  pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar6 = pvVar3->first;
  pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                     ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      CONCAT44(iVar6,in_stack_ffffffffffffffe0));
  if (iVar6 == pvVar3->second) {
    std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
              ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT44(iVar6,in_stack_ffffffffffffffe0));
  }
  else {
    pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                       ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        CONCAT44(iVar6,in_stack_ffffffffffffffe0));
    iVar5 = pvVar3->first;
    pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                       ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        CONCAT44(iVar6,iVar5));
    if (iVar5 < pvVar3->second) {
      pvVar3 = std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front
                         ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          CONCAT44(iVar6,iVar5));
      pvVar3->first = pvVar3->first + 1;
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return iVar1;
}

Assistant:

int pop() {
      if (indexContainer_.empty()) { std::cerr << "" << std::endl; }

      int result;

      result = indexContainer_.front().first;

      if (indexContainer_.front().first == indexContainer_.front().second) {
        indexContainer_.pop_front();
      } else if (indexContainer_.front().first <
                 indexContainer_.front().second) {
        ++indexContainer_.front().first;
      } else {
        std::cerr << "" << std::endl;
      }

      return result;
    }